

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::Simple8b<true>::decodeArray
          (Simple8b<true> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t *puVar2;
  NotEnoughStorage *this_00;
  ulong req;
  ulong *puVar3;
  
  uVar1 = *in;
  req = (ulong)uVar1;
  if (*nvalue < req) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,req);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar3 = (ulong *)(in + 1);
  *nvalue = req;
  if (0xf0 < uVar1) {
    puVar2 = (uint32_t *)
             (*(code *)(&DAT_0019d4d0 + *(int *)(&DAT_0019d4d0 + (*puVar3 >> 0x3c) * 4)))();
    return puVar2;
  }
  if (out < out + req) {
    puVar2 = (uint32_t *)
             (*(code *)(&DAT_0019d510 + *(int *)(&DAT_0019d510 + (*puVar3 >> 0x3c) * 4)))();
    return puVar2;
  }
  *nvalue = req;
  return (uint32_t *)puVar3;
}

Assistant:

const uint32_t *Simple8b<MarkLength>::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                                  const size_t len,
                                                  uint32_t *out,
                                                  size_t &nvalue) {
#else
                                                  const size_t, uint32_t *out,
                                                  size_t &nvalue) {
#endif
#ifndef NDEBUG
  // const uint32_t * const initin(in);
  const uint32_t *const endin(in + len);
#endif
#ifdef STATS
  std::vector<uint32_t> stats(16, 0);
#endif
  uint32_t markednvalue;
  if (MarkLength) {
    markednvalue = *in++;
    if (markednvalue > nvalue)
      throw NotEnoughStorage(markednvalue);
  }
  const size_t actualvalue = MarkLength ? markednvalue : nvalue;
  // this may lead to unaligned access. Performance may be affected.
  // not much of an effect in practice on recent Intel processors.
  const uint64_t *in64 = reinterpret_cast<const uint64_t *>(in);
#ifndef NDEBUG
  const uint64_t *finalin64 = reinterpret_cast<const uint64_t *>(endin);
#endif

  if (nvalue < actualvalue)
    fprintf(stderr, "possible overrun\n");
  nvalue = actualvalue;
  const uint32_t *const end = out + nvalue;
  const uint32_t *const initout(out);
  while (end > out + 240) {
#ifdef STATS
    stats[which(in64)]++;
#endif
    switch (which(in64)) {
    case 0:
      unpack<240, 0>(out, in64);
      break;
    case 1:
      unpack<120, 0>(out, in64);
      break;
    case 2:
      unpack<60, 1>(out, in64);
      break;
    case 3:
      unpack<30, 2>(out, in64);
      break;
    case 4:
      unpack<20, 3>(out, in64);
      break;
    case 5:
      unpack<15, 4>(out, in64);
      break;
    case 6:
      unpack<12, 5>(out, in64);
      break;
    case 7:
      unpack<10, 6>(out, in64);
      break;
    case 8:
      unpack<8, 7>(out, in64);
      break;
    case 9:
      unpack<7, 8>(out, in64);
      break;
    case 10:
      unpack<6, 10>(out, in64);
      break;
    case 11:
      unpack<5, 12>(out, in64);
      break;
    case 12:
      unpack<4, 15>(out, in64);
      break;
    case 13:
      unpack<3, 20>(out, in64);
      break;
    case 14:
      unpack<2, 30>(out, in64);
      break;
    case 15:
      unpack<1, 60>(out, in64);
      break;
    default:
      throw std::logic_error("hmmm how could that happen?");
    }
  }
  while (end > out) {
#ifdef STATS
    stats[which(in64)]++;
#endif
    switch (which(in64)) {
    case 0:
      carefulunpack<0>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 240), out, in64);
      break;
    case 1:
      carefulunpack<0>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 120), out, in64);
      break;
    case 2:
      carefulunpack<1>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 60), out, in64);
      break;
    case 3:
      carefulunpack<2>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 30), out, in64);
      break;
    case 4:
      carefulunpack<3>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 20), out, in64);
      break;
    case 5:
      carefulunpack<4>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 15), out, in64);
      break;
    case 6:
      carefulunpack<5>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 12), out, in64);
      break;
    case 7:
      carefulunpack<6>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 10), out, in64);
      break;
    case 8:
      carefulunpack<7>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 8), out, in64);
      break;
    case 9:
      carefulunpack<8>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 7), out, in64);
      break;
    case 10:
      carefulunpack<10>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 6), out, in64);
      break;
    case 11:
      carefulunpack<12>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 5), out, in64);
      break;
    case 12:
      carefulunpack<15>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 4), out, in64);
      break;
    case 13:
      carefulunpack<20>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 3), out, in64);
      break;
    case 14:
      carefulunpack<30>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 2), out, in64);
      break;
    case 15:
      carefulunpack<60>(1, out, in64);
      break;
    default:
      throw std::logic_error("hmmm how could that happen?");
    }
  }

#ifdef STATS
  uint32_t sum = std::accumulate(stats.begin(), stats.end(), 0);
  for (uint32_t k = 0; k < stats.size(); ++k) {
    printf("simple8b stats[%u]=%f\n", k, stats[k] * 1.0 / sum);
  }
#endif
  assert(in64 <= finalin64);
  in = reinterpret_cast<const uint32_t *>(in64);
  assert(in <= endin);
  // check that we don't overrun the buffer too much?
  ASSERT(out < end + 240, std::to_string(out - end));
  nvalue = MarkLength ? actualvalue : out - initout;
  return in;
}